

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

bool __thiscall minja::Value::operator>(Value *this,Value *other)

{
  value_t vVar1;
  bool bVar2;
  runtime_error *prVar3;
  double dVar4;
  double dVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar2 = is_null(this);
  if (bVar2) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Undefined value or reference");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  vVar1 = (this->primitive_).m_data.m_type;
  if ((byte)(vVar1 - number_integer) < 3) {
    if (2 < (byte)((other->primitive_).m_data.m_type - number_integer)) {
LAB_001b0bb7:
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      dump_abi_cxx11_(&local_60,this,-1,false);
      std::operator+(&local_40,"Cannot compare values: ",&local_60);
      std::operator+(&local_a0,&local_40," > ");
      dump_abi_cxx11_(&local_80,other,-1,false);
      std::operator+(&local_c0,&local_a0,&local_80);
      std::runtime_error::runtime_error(prVar3,(string *)&local_c0);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    dVar4 = get<double>(this);
    dVar5 = get<double>(other);
    bVar2 = dVar5 < dVar4;
  }
  else {
    if ((vVar1 != string) || ((other->primitive_).m_data.m_type != string)) goto LAB_001b0bb7;
    get<std::__cxx11::string>(&local_c0,this);
    get<std::__cxx11::string>(&local_a0,other);
    bVar2 = std::operator>(&local_c0,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  return bVar2;
}

Assistant:

bool operator>(const Value & other) const {
    if (is_null())
      throw std::runtime_error("Undefined value or reference");
    if (is_number() && other.is_number()) return get<double>() > other.get<double>();
    if (is_string() && other.is_string()) return get<std::string>() > other.get<std::string>();
    throw std::runtime_error("Cannot compare values: " + dump() + " > " + other.dump());
  }